

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O1

void libcmselect_LTX_polling_function(CMtrans_services svc,void *client_data)

{
  int iVar1;
  int in_ECX;
  select_data_ptr sd;
  
  sd = *client_data;
  if (sd == (select_data_ptr)0x0) {
    init_select_data(svc,(select_data_ptr *)client_data,(CManager_conflict)0x0);
    sd = *client_data;
  }
  if (sd->cm != (CManager)0x0) {
    iVar1 = (*svc->return_CM_lock_status)
                      (sd->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
                       ,0x413);
    if (iVar1 == 0) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
             ,0x413,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
  }
  socket_select(svc,sd,0,in_ECX);
  return;
}

Assistant:

extern void
libcmselect_LTX_polling_function(CMtrans_services svc, void *client_data)
{
    select_data_ptr sd = *((select_data_ptr *)client_data);
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)client_data, (CManager)NULL);
	sd = *((select_data_ptr *)client_data);
    }
    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    socket_select(svc, sd, 0, 0); /* no blocking, immediate timeout */
}